

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_array_int64(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int __fd;
  undefined1 *__buf;
  void *pvVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  void *__s1;
  void *__s2;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 *unaff_R12;
  undefined1 *unaff_R13;
  undefined1 *__n;
  void *unaff_R14;
  ulong unaff_R15;
  bson_t compare;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_880 [4];
  uint uStack_87c;
  undefined1 auStack_800 [4];
  uint uStack_7fc;
  undefined1 auStack_780 [200];
  undefined1 auStack_6b8 [648];
  undefined1 *puStack_430;
  undefined1 *puStack_428;
  undefined1 *puStack_420;
  void *pvStack_418;
  ulong uStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [4];
  uint local_3fc;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  __buf = auStack_400;
  __n = auStack_400;
  pcStack_408 = (code *)0x12eff2;
  bson_init(auStack_400);
  pcStack_408 = (code *)0x12f00b;
  bson_append_int64(auStack_400,"0",1,0x7b);
  pcStack_408 = (code *)0x12f024;
  bson_append_int64(auStack_400,"1",1,0x2a);
  pcStack_408 = (code *)0x12f047;
  cVar1 = bson_init_from_json(local_380,
                              "[ { \"$numberLong\" : \"123\" },  { \"$numberLong\" : \"42\" } ]",
                              0xffffffffffffffff,local_2b8);
  puStack_420 = unaff_R13;
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x12f05f;
    unaff_R14 = (void *)bson_get_data(local_380);
    pcStack_408 = (code *)0x12f06d;
    __buf = (undefined1 *)bson_get_data(auStack_400);
    if (local_3fc == local_37c) {
      pcStack_408 = (code *)0x12f086;
      pvVar5 = (void *)bson_get_data(auStack_400);
      pcStack_408 = (code *)0x12f096;
      pvVar6 = (void *)bson_get_data(local_380);
      pcStack_408 = (code *)0x12f0a5;
      iVar2 = bcmp(pvVar5,pvVar6,(ulong)local_3fc);
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x12f0b1;
        bson_destroy(auStack_400);
        pcStack_408 = (code *)0x12f0be;
        bson_destroy(local_380);
        return;
      }
    }
    unaff_R12 = local_380;
    pcStack_408 = (code *)0x12f0df;
    uVar7 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_408 = (code *)0x12f0ef;
    bson_as_canonical_extended_json(auStack_400,0);
    uVar3 = local_3fc;
    if (local_37c < local_3fc) {
      uVar3 = local_37c;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      uVar3 = local_3fc;
      if (local_37c <= local_3fc) {
        uVar3 = local_37c;
      }
      lVar11 = 0;
      do {
        if (*(char *)((long)unaff_R14 + lVar11) != __buf[lVar11]) {
          uVar4 = (uint)lVar11;
          break;
        }
        lVar11 = lVar11 + 1;
      } while (uVar3 != (uint)lVar11);
    }
    uVar3 = local_37c;
    if (local_37c < local_3fc) {
      uVar3 = local_3fc;
    }
    uVar3 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    pcStack_408 = (code *)0x12f156;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar7);
    pcStack_408 = (code *)0x12f16e;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_408 = (code *)0x12f189;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012f1d5:
      pcStack_408 = (code *)0x12f1da;
      test_bson_json_array_int64_cold_6();
LAB_0012f1da:
      pcStack_408 = (code *)0x12f1df;
      test_bson_json_array_int64_cold_5();
LAB_0012f1df:
      pcStack_408 = (code *)0x12f1e4;
      test_bson_json_array_int64_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      __n = auStack_400;
      if (uVar4 == 0xffffffff) goto LAB_0012f1da;
      __n = (undefined1 *)(ulong)local_37c;
      pcStack_408 = (code *)0x12f1ad;
      puVar8 = (undefined1 *)write(uVar3,unaff_R14,(size_t)__n);
      if (puVar8 != __n) goto LAB_0012f1df;
      unaff_R14 = (void *)(ulong)local_3fc;
      pcStack_408 = (code *)0x12f1c5;
      pvVar5 = (void *)write(uVar4,__buf,(size_t)unaff_R14);
      if (pvVar5 == unaff_R14) {
        pcStack_408 = (code *)0x12f1d5;
        test_bson_json_array_int64_cold_4();
        goto LAB_0012f1d5;
      }
    }
    pcStack_408 = (code *)0x12f1e9;
    test_bson_json_array_int64_cold_3();
    puStack_420 = __n;
  }
  pcStack_408 = test_bson_json_array_subdoc;
  test_bson_json_array_int64_cold_1();
  puStack_430 = __buf;
  puStack_428 = unaff_R12;
  pvStack_418 = unaff_R14;
  uStack_410 = unaff_R15;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_880);
  bson_init(auStack_780);
  bson_append_int32(auStack_780,"a",1,0x7b);
  bson_append_document(auStack_880,"0",1,auStack_780);
  cVar1 = bson_init_from_json(auStack_800,"[ { \"a\" : 123 } ]",0xffffffffffffffff,auStack_6b8);
  if (cVar1 == '\0') goto LAB_0012f41e;
  pvVar5 = (void *)bson_get_data(auStack_800);
  pvVar6 = (void *)bson_get_data(auStack_880);
  if (uStack_87c == uStack_7fc) {
    __s1 = (void *)bson_get_data(auStack_880);
    __s2 = (void *)bson_get_data(auStack_800);
    iVar2 = bcmp(__s1,__s2,(ulong)uStack_87c);
    if (iVar2 == 0) {
      bson_destroy(auStack_880);
      bson_destroy(auStack_800);
      return;
    }
  }
  uVar7 = bson_as_canonical_extended_json(auStack_800,0);
  uVar9 = bson_as_canonical_extended_json(auStack_880,0);
  uVar3 = uStack_87c;
  if (uStack_7fc < uStack_87c) {
    uVar3 = uStack_7fc;
  }
  uVar4 = 0xffffffff;
  if (uVar3 != 0) {
    uVar3 = uStack_87c;
    if (uStack_7fc <= uStack_87c) {
      uVar3 = uStack_7fc;
    }
    lVar11 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar11) != *(char *)((long)pvVar6 + lVar11)) {
        uVar4 = (uint)lVar11;
        break;
      }
      lVar11 = lVar11 + 1;
    } while (uVar3 != (uint)lVar11);
  }
  uVar3 = uStack_7fc;
  if (uStack_7fc < uStack_87c) {
    uVar3 = uStack_87c;
  }
  uVar3 = uVar3 - 1;
  if (uVar4 != 0xffffffff) {
    uVar3 = uVar4;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar7,uVar9);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
LAB_0012f40a:
    test_bson_json_array_subdoc_cold_6();
LAB_0012f40f:
    test_bson_json_array_subdoc_cold_5();
LAB_0012f414:
    test_bson_json_array_subdoc_cold_2();
  }
  else {
    if (__fd == -1) goto LAB_0012f40f;
    uVar10 = write(iVar2,pvVar5,(ulong)uStack_7fc);
    if (uVar10 != uStack_7fc) goto LAB_0012f414;
    uVar10 = write(__fd,pvVar6,(ulong)uStack_87c);
    if (uVar10 == uStack_87c) {
      test_bson_json_array_subdoc_cold_4();
      goto LAB_0012f40a;
    }
  }
  test_bson_json_array_subdoc_cold_3();
LAB_0012f41e:
  test_bson_json_array_subdoc_cold_1();
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : \"2016-12-13T12:34:56.123Z\" } }",0x158f82db9fb);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:00.000Z\" } }",0);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1969-12-31T16:00:00.000-0800\" } }",0);
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+01:00\" } }","Could not parse");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:\" } }",
             "reached end of date while looking for seconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:+01:00\" } }","seconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:00.\" } }",
             "reached end of date while looking for milliseconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.+01:00\" } }",
             "milliseconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"foo-01-01T00:00:00.000Z\" } }","year must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-foo-01T00:00:00.000Z\" } }","month must be an integer"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-fooT00:00:00.000Z\" } }","day must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01Tfoo:00:00.000Z\" } }","hour must be an integer")
  ;
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:foo:00.000Z\" } }",
             "minute must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:foo.000Z\" } }",
             "seconds must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000X\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+1\" } }","could not parse timezone"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+xx00\" } }",
             "could not parse timezone");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+0060\" } }",
             "timezone minute must be at most 59");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-0060\" } }",
             "timezone minute must be at most 59");
  return;
}

Assistant:

static void
test_bson_json_array_int64 (void)
{
   bson_error_t error;
   const char *json = "[ { \"$numberLong\" : \"123\" },"
                      "  { \"$numberLong\" : \"42\" } ]";
   bson_t b, compare;
   bool r;

   bson_init (&compare);
   bson_append_int64 (&compare, "0", 1, 123);
   bson_append_int64 (&compare, "1", 1, 42);

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);

   bson_eq_bson (&b, &compare);
   bson_destroy (&compare);
   bson_destroy (&b);
}